

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

bool ON_Intersect(ON_Plane *R,ON_Plane *S,ON_Line *L)

{
  double *__return_storage_ptr__;
  byte bVar1;
  ON_3dPoint local_118;
  byte local_e9;
  undefined1 local_e8 [7];
  bool rc;
  ON_Plane T;
  undefined1 local_50 [8];
  ON_3dPoint p;
  ON_3dVector d;
  ON_Line *L_local;
  ON_Plane *S_local;
  ON_Plane *R_local;
  
  ON_CrossProduct((ON_3dVector *)&p.z,&S->zaxis,&R->zaxis);
  __return_storage_ptr__ = &T.plane_equation.d;
  ON_3dPoint::operator+((ON_3dPoint *)__return_storage_ptr__,&R->origin,&S->origin);
  operator*((ON_3dPoint *)local_50,0.5,(ON_3dPoint *)__return_storage_ptr__);
  ON_Plane::ON_Plane((ON_Plane *)local_e8,(ON_3dPoint *)local_50,(ON_3dVector *)&p.z);
  local_e9 = ON_Intersect(R,S,(ON_Plane *)local_e8,&L->from);
  ON_3dPoint::operator+(&local_118,&L->from,(ON_3dVector *)&p.z);
  bVar1 = local_e9;
  (L->to).x = local_118.x;
  (L->to).y = local_118.y;
  (L->to).z = local_118.z;
  ON_Plane::~ON_Plane((ON_Plane *)local_e8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_Intersect( const ON_Plane& R, const ON_Plane& S,
                   ON_Line& L )
{
  ON_3dVector d = ON_CrossProduct( S.zaxis, R.zaxis );
  ON_3dPoint p = 0.5*(R.origin + S.origin);
  ON_Plane T( p, d );
  bool rc = ON_Intersect( R, S, T, L.from );
  L.to = L.from + d;
  return rc;
}